

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::setEquilibriumPoint(btGeneric6DofSpring2Constraint *this)

{
  btScalar *pbVar1;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  btScalar bVar2;
  int local_c;
  
  calculateTransforms((btGeneric6DofSpring2Constraint *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x5ac));
    bVar2 = pbVar1[local_c];
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x374));
    pbVar1[local_c] = bVar2;
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x56c));
    *(btScalar *)(in_RDI + (long)local_c * 0x58 + 0x424) = pbVar1[local_c];
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setEquilibriumPoint()
{
	calculateTransforms();
	int i;
	for( i = 0; i < 3; i++)
		m_linearLimits.m_equilibriumPoint[i] = m_calculatedLinearDiff[i];
	for(i = 0; i < 3; i++)
		m_angularLimits[i].m_equilibriumPoint = m_calculatedAxisAngleDiff[i];
}